

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_detail.h
# Opt level: O0

void boost::spirit::traits::
     assign_to_attribute_from_value<lf::io::GMshFileV4::ElementType,_boost::endian::endian_arithmetic<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>,_void>
     ::call(endian_arithmetic<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
            *raw,ElementType *cat)

{
  ElementType EVar1;
  value_type_conflict1 value;
  ElementType *cat_local;
  endian_arithmetic<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *raw_local
  ;
  
  EVar1 = endian::endian_arithmetic::operator_cast_to_unsigned_int((endian_arithmetic *)raw);
  *cat = EVar1;
  return;
}

Assistant:

static void call(RawValue const& raw, Enum& cat) {
    if constexpr (detail::has_value_type<RawValue>::value) {  // NOLINT
      // specialization for endian::endian
      const typename RawValue::value_type value = raw;
      cat = static_cast<Enum>(value);
    } else {  // NOLINT
      cat = static_cast<Enum>(raw);
    }
  }